

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O0

int assign_dv(AV1_COMMON *cm,MACROBLOCKD *xd,int_mv *mv,int_mv *ref_mv,int mi_row,int mi_col,
             BLOCK_SIZE bsize,aom_reader *r)

{
  int iVar1;
  MV *in_RDX;
  long in_RSI;
  int valid;
  FRAME_CONTEXT *ec_ctx;
  undefined3 in_stack_00000051;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  MV *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  uint uVar2;
  undefined4 in_stack_ffffffffffffffcc;
  
  read_mv(*(aom_reader **)(in_RSI + 0x2998),
          (MV *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
          in_stack_ffffffffffffffc0,
          (nmv_context *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),'\0');
  in_RDX->col = (int16_t)(((int)in_RDX->col >> 3) << 3);
  in_RDX->row = (int16_t)(((int)in_RDX->row >> 3) << 3);
  iVar1 = is_mv_valid(in_RDX);
  uVar2 = 0;
  if (iVar1 != 0) {
    iVar1 = av1_is_dv_valid(cm._0_4_,(AV1_COMMON *)xd,(MACROBLOCKD *)&mv->as_mv,ref_mv._4_4_,
                            (int)ref_mv,mi_row._3_1_,_bsize);
    uVar2 = (uint)(iVar1 != 0) << 0x18;
  }
  return uVar2 >> 0x18;
}

Assistant:

static inline int assign_dv(AV1_COMMON *cm, MACROBLOCKD *xd, int_mv *mv,
                            const int_mv *ref_mv, int mi_row, int mi_col,
                            BLOCK_SIZE bsize, aom_reader *r) {
  FRAME_CONTEXT *ec_ctx = xd->tile_ctx;
  read_mv(r, &mv->as_mv, &ref_mv->as_mv, &ec_ctx->ndvc, MV_SUBPEL_NONE);
  // DV should not have sub-pel.
  assert((mv->as_mv.col & 7) == 0);
  assert((mv->as_mv.row & 7) == 0);
  mv->as_mv.col = (mv->as_mv.col >> 3) * 8;
  mv->as_mv.row = (mv->as_mv.row >> 3) * 8;
  int valid = is_mv_valid(&mv->as_mv) &&
              av1_is_dv_valid(mv->as_mv, cm, xd, mi_row, mi_col, bsize,
                              cm->seq_params->mib_size_log2);
  return valid;
}